

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __y;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_reference pvVar4;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *this_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RSI;
  undefined8 in_RDI;
  optional<unsigned_long> oVar7;
  type tVar8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar9;
  value_type vVar10;
  type sv1;
  type sv0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  undefined6 in_stack_fffffffffffffed8;
  semantic_tag in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  jsonpath_errc __e;
  error_code *in_stack_fffffffffffffef0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  type local_80;
  type local_70 [2];
  undefined4 local_50;
  _Storage<unsigned_long,_true> local_30;
  undefined1 local_28;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  __e = (jsonpath_errc)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_18 = in_RDX;
  sVar2 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  oVar7 = function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity(in_RSI);
  local_30._M_value =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_28 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x616e99);
  if (sVar2 != *puVar3) {
    std::error_code::operator=(in_stack_fffffffffffffef0,__e);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffee0,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    uVar6 = extraout_RDX;
    goto LAB_0061719d;
  }
  pvVar4 = std::
           vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](local_18,0);
  parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
            (pvVar4);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_stack_fffffffffffffee0,
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                    (in_stack_fffffffffffffef8);
  if (bVar1) {
    pvVar4 = std::
             vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,1);
    parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (pvVar4);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffee0,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      (in_stack_fffffffffffffef8);
    if (bVar1) {
      local_70[0] = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                *)0x617010);
      tVar8 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
              as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         0x617043);
      local_80 = tVar8;
      this_00 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(&local_80);
      pbVar5 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(local_70);
      if (this_00 <= pbVar5) {
        in_stack_fffffffffffffee0 =
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(local_70);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(&local_80);
        bVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                          (this_00,(size_type)in_stack_fffffffffffffef8,
                           (size_type)in_stack_fffffffffffffef0);
        __x._M_str = (wchar_t *)tVar8._M_len;
        __x._M_len = (size_t)tVar8._M_str;
        __y._M_str = (wchar_t *)this_00;
        __y._M_len = bVar9._M_len;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) {
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                    (in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf,
                     in_stack_fffffffffffffede);
          goto LAB_00617172;
        }
      }
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf,in_stack_fffffffffffffede
                );
    }
    else {
      std::error_code::operator=(in_stack_fffffffffffffef0,__e);
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (in_stack_fffffffffffffee0,
                 (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    }
LAB_00617172:
    local_50 = 1;
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x61717f);
  }
  else {
    std::error_code::operator=(in_stack_fffffffffffffef0,__e);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_fffffffffffffee0,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    local_50 = 1;
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x61718c);
  uVar6 = extraout_RDX_00;
LAB_0061719d:
  vVar10.field_0.int64_.val_ = uVar6;
  vVar10.field_0._0_8_ = in_RDI;
  return (value_type)vVar10.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto arg1= args[1].value();
            if (!arg1.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto sv0 = arg0.template as<string_view_type>();
            auto sv1 = arg1.template as<string_view_type>();

            if (sv1.length() <= sv0.length() && sv1 == sv0.substr(sv0.length() - sv1.length()))
            {
                return value_type(true, semantic_tag::none);
            }
            return value_type(false, semantic_tag::none);
        }